

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

bool __thiscall google::protobuf::internal::ExtensionSet::Has(ExtensionSet *this,int number)

{
  byte bVar1;
  Extension *pEVar2;
  
  pEVar2 = FindOrNull(this,number);
  if (pEVar2 == (Extension *)0x0) {
    bVar1 = 0;
  }
  else {
    bVar1 = pEVar2->field_0xa ^ 1;
  }
  return (bool)(bVar1 & 1);
}

Assistant:

bool ExtensionSet::Has(int number) const {
  const Extension* ext = FindOrNull(number);
  if (ext == NULL) return false;
  GOOGLE_DCHECK(!ext->is_repeated);
  return !ext->is_cleared;
}